

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O1

int testIsChild(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  string local_80;
  string local_60;
  int local_3c;
  int local_38;
  int local_34;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary/","");
  paVar2 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/Norman/Bird/Sanctuary","");
  iVar3 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Sanctuary",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," to ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Sanctuary",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," result=",8);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary/","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/Norman/Bird/Sanctuary","");
  iVar4 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  plVar6 = (long *)std::ostream::operator<<(&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary/","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"/Norman/Bird/Sanctuary/Egret","");
  iVar4 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Sanctuary",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," to ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Sanctuary/Egret",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," result=",8);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary/","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"/Norman/Bird/Sanctuary/Egret","");
  iVar5 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  plVar6 = (long *)std::ostream::operator<<(&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"/Norman/Bird/Sanctuary/Egret/Baby","");
  local_34 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_3c = iVar4;
  local_38 = iVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Sanctuary",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," to ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Sanctuary/Egret/Baby",0x21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," result=",8);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"/Norman/Bird/Sanctuary/Egret/Baby","");
  iVar3 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  plVar6 = (long *)std::ostream::operator<<(&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/Norman/Bird/Egret","");
  iVar3 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Sanctuary",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," to ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Egret",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," result=",8);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/Norman/Bird/Egret","");
  iVar4 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  plVar6 = (long *)std::ostream::operator<<(&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"hello darling","");
  iVar4 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"/Norman/Bird/Sanctuary",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," to ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hello darling",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," result=",8);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Norman/Bird/Sanctuary","");
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"hello darling","");
  iVar5 = MinVR::VRDataIndex::isChild(&local_60,&local_80);
  plVar6 = (long *)std::ostream::operator<<(&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return (uint)(iVar4 != -1) + (uint)(iVar3 != -1) + (uint)(local_34 != 2) +
         (((local_3c != 1) + 1) - (uint)(local_38 == 0));
}

Assistant:

int testIsChild() {

  int out = 0;

  LOOP {
    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                        "/Norman/Bird/Sanctuary") == 0) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                             "/Norman/Bird/Sanctuary")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                        "/Norman/Bird/Sanctuary/Egret") == 1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary/Egret"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                             "/Norman/Bird/Sanctuary/Egret")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "/Norman/Bird/Sanctuary/Egret/Baby") == 2) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary/Egret/Baby"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "/Norman/Bird/Sanctuary/Egret/Baby")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "/Norman/Bird/Egret") == -1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Egret"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "/Norman/Bird/Egret")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "hello darling") == -1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "hello darling"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "hello darling")
              << std::endl;
  }